

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O2

bool __thiscall GF2::VSubst<8UL>::Next(VSubst<8UL> *this)

{
  word y;
  word wVar1;
  ulong uVar2;
  word wVar3;
  
  for (wVar1 = 0xff; wVar1 != 0; wVar1 = wVar1 - 1) {
    uVar2 = (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[wVar1 - 1]._words[0];
    if (uVar2 <= (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[wVar1]._words[0]
       ) {
      wVar3 = wVar1;
      goto LAB_001332fc;
    }
  }
  SetId(this);
  goto LAB_001332e2;
  while (wVar3 = y + 1,
        uVar2 < (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[y + 1]._words[0])
  {
LAB_001332fc:
    y = wVar3;
    if (y == 0xff) break;
  }
  Transpose(this,wVar1 - 1,y);
  uVar2 = 0xff;
  for (wVar3 = wVar1; wVar3 < uVar2; wVar3 = wVar3 + 1) {
    Transpose(this,wVar3,uVar2);
    uVar2 = uVar2 - 1;
  }
LAB_001332e2:
  return wVar1 != 0;
}

Assistant:

bool Next()
	{
		// ищем с конца убывающую цепочку
		word i = _size - 2;
		while (i != WORD_MAX && Get(i) > Get(i + 1)) i--;
		// достигли начала, т.е. последняя подстановка?
		if (i == WORD_MAX)
		{
			First();
			return false;
		}
		// здесь s[i] < s[i + 1] > .... > s[_size - 1]
		word j = i + 1;
		while (j + 1 < _size && Get(j + 1) > Get(i)) j++;
		// теперь s[i] < s[j] и s[i] > s[j + 1]
		// выполняем транспозиции
		Transpose(i, j);
		j = _size;
		while (++i < --j)
			Transpose(i, j);
		// не последняя подстановка 
		return true;
	}